

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLkParser.cpp
# Opt level: O0

void __thiscall antlr::LLkParser::trace(LLkParser *this,char *ee,char *rname)

{
  ostream *poVar1;
  ParserInputState *pPVar2;
  Token *pTVar3;
  char *in_RDX;
  char *in_RSI;
  char *pcVar4;
  long *in_RDI;
  ANTLRException *ae;
  string temp;
  int i;
  TokenRefCount<antlr::Token> *in_stack_ffffffffffffff60;
  TokenRefCount<antlr::Token> local_68;
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0xd8))();
  poVar1 = std::operator<<((ostream *)&std::cout,local_10);
  poVar1 = std::operator<<(poVar1,local_18);
  pPVar2 = RefCount<antlr::ParserInputState>::operator->
                     ((RefCount<antlr::ParserInputState> *)(in_RDI + 1));
  pcVar4 = "; ";
  if (0 < pPVar2->guessing) {
    pcVar4 = "; [guessing]";
  }
  std::operator<<(poVar1,pcVar4);
  for (local_1c = 1; local_1c <= *(int *)((long)in_RDI + 0x1c); local_1c = local_1c + 1) {
    if (local_1c != 1) {
      std::operator<<((ostream *)&std::cout,", ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"LA(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
    std::operator<<(poVar1,")==");
    std::__cxx11::string::string(local_40);
    (**(code **)(*in_RDI + 0x18))(&local_68,in_RDI,local_1c);
    pTVar3 = TokenRefCount<antlr::Token>::operator->(&local_68);
    (*pTVar3->_vptr_Token[4])(local_60);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=(local_40,pcVar4);
    std::__cxx11::string::~string(local_60);
    TokenRefCount<antlr::Token>::~TokenRefCount(in_stack_ffffffffffffff60);
    std::operator<<((ostream *)&std::cout,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LLkParser::trace(const char* ee, const char* rname)
{
	traceIndent();

	cout << ee << rname << ((inputState->guessing>0)?"; [guessing]":"; ");

	for (int i = 1; i <= k; i++)
	{
		if (i != 1) {
			cout << ", ";
		}
		cout << "LA(" << i << ")==";

		string temp;

		try {
			temp = LT(i)->getText().c_str();
		}
		catch( ANTLRException& ae )
		{
			temp = "[error: ";
			temp += ae.toString();
			temp += ']';
		}
		cout << temp;
	}

	cout << endl;
}